

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O2

void mdiffflush(memfile *mf)

{
  uint bytes;
  
  if (mf->curcmd != MDIFF_INVALID) {
    mdiffwrite14(mf,mf->curcmd,mf->curcount);
    if (mf->curcmd == MDIFF_EDIT) {
      bytes = mf->curcount;
      if ((int)bytes < 0 || mf->pos < (int)bytes) {
        panic("mdiffflush: trying to edit with too much data");
      }
      mdiffwrite(mf,mf->buf + ((long)mf->pos - (long)(int)bytes),bytes);
    }
  }
  mf->curcmd = MDIFF_INVALID;
  return;
}

Assistant:

void mdiffflush(struct memfile *mf)
{
	if (mf->curcmd != MDIFF_INVALID)
	    mdiffwrite14(mf, mf->curcmd, mf->curcount);
	if (mf->curcmd == MDIFF_EDIT) {
	    /* We need to record the actual data to edit with, too. */
	    if (mf->curcount > mf->pos || mf->curcount < 0)
		panic("mdiffflush: trying to edit with too much data");
	    mdiffwrite(mf, mf->buf + mf->pos - mf->curcount, mf->curcount);
	}
	mf->curcmd = MDIFF_INVALID;
}